

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::SerializeWithCachedSizes
          (RandomBernoulliDynamicLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  RandomBernoulliDynamicLayerParams *this_local;
  
  iVar1 = seed(this);
  if (iVar1 != 0) {
    iVar1 = seed(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  fVar2 = prob(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = prob(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  return;
}

Assistant:

void RandomBernoulliDynamicLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float prob = 2;
  if (this->prob() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->prob(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomBernoulliDynamicLayerParams)
}